

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O3

string * __thiscall
duckdb::Binding::GetAlias_abi_cxx11_(string *__return_storage_ptr__,Binding *this)

{
  pointer pcVar1;
  string *psVar2;
  
  psVar2 = BindingAlias::GetAlias_abi_cxx11_(&this->alias);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string Binding::GetAlias() const {
	return alias.GetAlias();
}